

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::RegexMatcher::operator()
          (AssertionResult *__return_storage_ptr__,RegexMatcher *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  RegexMatcher *this_local;
  
  local_20 = actual;
  actual_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (RegexMatcher *)__return_storage_ptr__;
  bVar1 = Regex(this,actual);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Regex(actual) )
        {
            return AssertionSuccess();
        }